

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

char * mpc_err_string(mpc_err_t *x)

{
  char *buffer_00;
  long lVar1;
  char *fmt;
  size_t sVar2;
  long in_RDI;
  char *buffer;
  int max;
  int pos;
  int i;
  int local_1c [3];
  long local_10;
  char *local_8;
  
  local_1c[1] = 0;
  local_1c[0] = 0x3ff;
  local_10 = in_RDI;
  buffer_00 = (char *)calloc(1,0x400);
  if (*(long *)(local_10 + 0x30) == 0) {
    lVar1 = *(long *)(local_10 + 0x10) + 1;
    mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,"%s:%li:%li: error: expected ",
                       *(undefined8 *)(local_10 + 0x28),*(long *)(local_10 + 8) + 1,lVar1);
    if (*(int *)(local_10 + 0x20) == 0) {
      mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,"ERROR: NOTHING EXPECTED");
    }
    if (*(int *)(local_10 + 0x20) == 1) {
      mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,"%s",**(undefined8 **)(local_10 + 0x38));
    }
    if (1 < *(int *)(local_10 + 0x20)) {
      for (local_1c[2] = 0; local_1c[2] < *(int *)(local_10 + 0x20) + -2;
          local_1c[2] = local_1c[2] + 1) {
        mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,"%s, ",
                           *(undefined8 *)(*(long *)(local_10 + 0x38) + (long)local_1c[2] * 8));
      }
      mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,"%s or %s",
                         *(undefined8 *)
                          (*(long *)(local_10 + 0x38) + (long)(*(int *)(local_10 + 0x20) + -2) * 8),
                         *(undefined8 *)
                          (*(long *)(local_10 + 0x38) + (long)(*(int *)(local_10 + 0x20) + -1) * 8),
                         lVar1);
    }
    mpc_err_string_cat(buffer_00,local_1c + 1,local_1c," at ");
    fmt = mpc_err_char_unescape(*(char *)(local_10 + 0x40));
    mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,fmt);
    mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,"\n");
    sVar2 = strlen(buffer_00);
    local_8 = (char *)realloc(buffer_00,sVar2 + 1);
  }
  else {
    mpc_err_string_cat(buffer_00,local_1c + 1,local_1c,"%s: error: %s\n",
                       *(undefined8 *)(local_10 + 0x28),*(undefined8 *)(local_10 + 0x30));
    local_8 = buffer_00;
  }
  return local_8;
}

Assistant:

char *mpc_err_string(mpc_err_t *x) {

  int i;
  int pos = 0;
  int max = 1023;
  char *buffer = calloc(1, 1024);

  if (x->failure) {
    mpc_err_string_cat(buffer, &pos, &max,
    "%s: error: %s\n", x->filename, x->failure);
    return buffer;
  }

  mpc_err_string_cat(buffer, &pos, &max,
    "%s:%li:%li: error: expected ", x->filename, x->state.row+1, x->state.col+1);

  if (x->expected_num == 0) { mpc_err_string_cat(buffer, &pos, &max, "ERROR: NOTHING EXPECTED"); }
  if (x->expected_num == 1) { mpc_err_string_cat(buffer, &pos, &max, "%s", x->expected[0]); }
  if (x->expected_num >= 2) {

    for (i = 0; i < x->expected_num-2; i++) {
      mpc_err_string_cat(buffer, &pos, &max, "%s, ", x->expected[i]);
    }

    mpc_err_string_cat(buffer, &pos, &max, "%s or %s",
      x->expected[x->expected_num-2],
      x->expected[x->expected_num-1]);
  }

  mpc_err_string_cat(buffer, &pos, &max, " at ");
  mpc_err_string_cat(buffer, &pos, &max, mpc_err_char_unescape(x->received));
  mpc_err_string_cat(buffer, &pos, &max, "\n");

  return realloc(buffer, strlen(buffer) + 1);
}